

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_perform_authentication(connectdata *conn)

{
  SASL *sasl;
  _Bool _Var1;
  CURLcode CVar2;
  undefined8 in_RAX;
  saslprogress progress;
  saslprogress local_14;
  
  local_14 = (saslprogress)((ulong)in_RAX >> 0x20);
  sasl = &(conn->proto).imapc.sasl;
  _Var1 = Curl_sasl_can_authenticate(sasl,conn);
  if (_Var1) {
    CVar2 = Curl_sasl_start(sasl,conn,(conn->proto).imapc.ir_supported,&local_14);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    if (local_14 != SASL_INPROGRESS) {
      if (((conn->proto).imapc.login_disabled == false) &&
         ((*(byte *)((long)&conn->proto + 0x98) & 1) != 0)) {
        CVar2 = imap_perform_login(conn);
        return CVar2;
      }
      Curl_infof(conn->data,"No known authentication mechanisms supported!\n");
      return CURLE_LOGIN_DENIED;
    }
    (conn->proto).imapc.state = IMAP_AUTHENTICATE;
  }
  else {
    (conn->proto).imapc.state = IMAP_STOP;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  saslprogress progress;

  /* Check we have enough data to authenticate with and end the
     connect phase if we don't */
  if(!Curl_sasl_can_authenticate(&imapc->sasl, conn)) {
    state(conn, IMAP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&imapc->sasl, conn, imapc->ir_supported, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      state(conn, IMAP_AUTHENTICATE);
    else if(!imapc->login_disabled && (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}